

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void vera::setFullscreen(bool _fullscreen)

{
  bool bVar1;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar2;
  
  bVar1 = isFullscreen();
  if ((bVar1 != _fullscreen) && (properties.style != EMBEDDED)) {
    if (_fullscreen) {
      glfwGetWindowPos(window,(int *)&viewport_last,&viewport_last.field_1.y);
      glfwGetWindowSize(window,&viewport_last.field_2.z,&viewport_last.field_3.w);
      handle = getMonitorFromWindow(window);
      pGVar2 = glfwGetVideoMode(handle);
      glfwSetWindowMonitor(window,handle,0,0,pGVar2->width,pGVar2->height,0);
      properties.style = FULLSCREEN;
    }
    else {
      glfwSetWindowMonitor
                (window,(GLFWmonitor *)0x0,viewport_last.field_0.x,viewport_last.field_1.y,
                 viewport_last.field_2.z,viewport_last.field_3.w,0);
      properties.style = REGULAR;
    }
  }
  return;
}

Assistant:

void setFullscreen(bool _fullscreen) {
    if ( isFullscreen() == _fullscreen || 
         properties.style == EMBEDDED)
        return;

#if defined(__EMSCRIPTEN__)
    if ( _fullscreen ) {
        properties.style = FULLSCREEN;

        EmscriptenFullscreenStrategy strategy{};

        strategy.scaleMode = EMSCRIPTEN_FULLSCREEN_SCALE_STRETCH;    
        strategy.filteringMode = EMSCRIPTEN_FULLSCREEN_FILTERING_DEFAULT;
        strategy.canvasResolutionScaleMode = EMSCRIPTEN_FULLSCREEN_CANVAS_SCALE_STDDEF;
        strategy.canvasResizedCallback = on_canvassize_changed;
        strategy.canvasResizedCallbackUserData = NULL;
        emscripten_enter_soft_fullscreen("#canvas", &strategy);
    }
    else {
        properties.style = FULLSCREEN;
    }
    
#elif defined(DRIVER_GLFW)
    if ( _fullscreen ) {
        // backup window position and window size
        glfwGetWindowPos( window, &viewport_last.x, &viewport_last.y );
        glfwGetWindowSize( window, &viewport_last.z, &viewport_last.w );
        
        // get resolution of monitor
        GLFWmonitor* monitor = getMonitorFromWindow(window);
        const GLFWvidmode * mode = glfwGetVideoMode(monitor);

        // switch to full screen
        glfwSetWindowMonitor( window, monitor, 0, 0, mode->width, mode->height, 0 );
        properties.style = FULLSCREEN;
    }
    else {
        // restore last window size and position
        glfwSetWindowMonitor( window, nullptr,  viewport_last.x, viewport_last.y, viewport_last.z, viewport_last.w, 0 );
        properties.style = REGULAR;
    }

#endif
}